

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O2

void __thiscall
Table_TableCannotBeMultiline2_Test::~Table_TableCannotBeMultiline2_Test
          (Table_TableCannotBeMultiline2_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Table, TableCannotBeMultiline2) {
    std::istringstream input("[table.\n123.\"table\\ntable\"]");
    events_aggregator_t handler;

    try {
        loltoml::parse(input, handler);
        FAIL();
    } catch (const loltoml::parser_error_t &e) {
        EXPECT_EQ(7, e.offset());
    }
}